

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::DecimalFormat(DecimalFormat *this,UErrorCode *status)

{
  Locale *this_00;
  char *pcVar1;
  NumberingSystem *pNVar2;
  char16_t *text;
  Locale local_158;
  undefined1 local_78 [8];
  UnicodeString patternString;
  LocalPointer<icu_63::NumberingSystem> ns;
  char *localeName;
  UErrorCode *status_local;
  DecimalFormat *this_local;
  
  DecimalFormat(this,(DecimalFormatSymbols *)0x0,status);
  this_00 = Locale::getDefault();
  pcVar1 = Locale::getName(this_00);
  pNVar2 = NumberingSystem::createInstance(status);
  LocalPointer<icu_63::NumberingSystem>::LocalPointer
            ((LocalPointer<icu_63::NumberingSystem> *)((long)&patternString.fUnion + 0x30),pNVar2);
  Locale::Locale(&local_158,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0);
  pNVar2 = LocalPointerBase<icu_63::NumberingSystem>::operator->
                     ((LocalPointerBase<icu_63::NumberingSystem> *)
                      ((long)&patternString.fUnion + 0x30));
  pcVar1 = NumberingSystem::getName(pNVar2);
  text = icu_63::number::impl::utils::getPatternForStyle
                   (&local_158,pcVar1,CLDR_PATTERN_STYLE_DECIMAL,status);
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_78,text);
  Locale::~Locale(&local_158);
  setPropertiesFromPattern(this,(UnicodeString *)local_78,1,status);
  touch(this,status);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
  LocalPointer<icu_63::NumberingSystem>::~LocalPointer
            ((LocalPointer<icu_63::NumberingSystem> *)((long)&patternString.fUnion + 0x30));
  return;
}

Assistant:

DecimalFormat::DecimalFormat(UErrorCode& status)
        : DecimalFormat(nullptr, status) {
    // Use the default locale and decimal pattern.
    const char* localeName = Locale::getDefault().getName();
    LocalPointer<NumberingSystem> ns(NumberingSystem::createInstance(status));
    UnicodeString patternString = utils::getPatternForStyle(
            localeName,
            ns->getName(),
            CLDR_PATTERN_STYLE_DECIMAL,
            status);
    setPropertiesFromPattern(patternString, IGNORE_ROUNDING_IF_CURRENCY, status);
    touch(status);
}